

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessage<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          LogicalType *params_1,LogicalType *params_2)

{
  pointer *ppEVar1;
  pointer pcVar2;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  _Alloc_hider params_1_00;
  LogicalType local_78;
  undefined1 local_60 [24];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_48;
  
  params_1_00._M_p = (pointer)0x0;
  ppEVar1 = &local_48.
             super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar2 = (msg->_M_dataplus)._M_p;
  local_48.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + msg->_M_string_length);
  LogicalType::LogicalType((LogicalType *)local_60,(LogicalType *)params);
  LogicalType::LogicalType(&local_78,params_1);
  ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (__return_storage_ptr__,this,(string *)&stack0xffffffffffffff68,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,&local_78
             ,(LogicalType *)params_1_00._M_p);
  LogicalType::~LogicalType(&local_78);
  LogicalType::~LogicalType((LogicalType *)local_60);
  if (local_48.
      super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
    operator_delete(local_48.
                    super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &stack0xffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}